

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableModel::clear(QTableModel *this)

{
  QTableModel *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  reference ppQVar3;
  QList<QTableWidgetItem_*> *this_01;
  long in_RDI;
  int k;
  int j;
  QTableWidgetItem *in_stack_ffffffffffffffc8;
  QList<QTableWidgetItem_*> *in_stack_ffffffffffffffd0;
  int local_10;
  int local_c;
  
  local_c = 0;
  while( true ) {
    this_00 = (QTableModel *)(long)local_c;
    qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x30));
    if (qVar1 <= (long)this_00) break;
    ppQVar2 = QList<QTableWidgetItem_*>::at
                        (in_stack_ffffffffffffffd0,(qsizetype)in_stack_ffffffffffffffc8);
    if (*ppQVar2 != (QTableWidgetItem *)0x0) {
      ppQVar2 = QList<QTableWidgetItem_*>::at
                          (in_stack_ffffffffffffffd0,(qsizetype)in_stack_ffffffffffffffc8);
      (*ppQVar2)->view = (QTableWidget *)0x0;
      ppQVar2 = QList<QTableWidgetItem_*>::at
                          (in_stack_ffffffffffffffd0,(qsizetype)in_stack_ffffffffffffffc8);
      if (*ppQVar2 != (QTableWidgetItem *)0x0) {
        (*(*ppQVar2)->_vptr_QTableWidgetItem[1])();
      }
      ppQVar3 = QList<QTableWidgetItem_*>::operator[]
                          (in_stack_ffffffffffffffd0,(qsizetype)in_stack_ffffffffffffffc8);
      *ppQVar3 = (QTableWidgetItem *)0x0;
    }
    local_c = local_c + 1;
  }
  local_10 = 0;
  while( true ) {
    this_01 = (QList<QTableWidgetItem_*> *)(long)local_10;
    qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x48));
    if (qVar1 <= (long)this_01) break;
    ppQVar2 = QList<QTableWidgetItem_*>::at(this_01,(qsizetype)in_stack_ffffffffffffffc8);
    if (*ppQVar2 != (QTableWidgetItem *)0x0) {
      ppQVar2 = QList<QTableWidgetItem_*>::at(this_01,(qsizetype)in_stack_ffffffffffffffc8);
      (*ppQVar2)->view = (QTableWidget *)0x0;
      ppQVar2 = QList<QTableWidgetItem_*>::at(this_01,(qsizetype)in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffc8 = *ppQVar2;
      if (in_stack_ffffffffffffffc8 != (QTableWidgetItem *)0x0) {
        (*in_stack_ffffffffffffffc8->_vptr_QTableWidgetItem[1])();
      }
      ppQVar3 = QList<QTableWidgetItem_*>::operator[](this_01,(qsizetype)in_stack_ffffffffffffffc8);
      *ppQVar3 = (QTableWidgetItem *)0x0;
    }
    local_10 = local_10 + 1;
  }
  clearContents(this_00);
  return;
}

Assistant:

void QTableModel::clear()
{
    for (int j = 0; j < verticalHeaderItems.size(); ++j) {
        if (verticalHeaderItems.at(j)) {
            verticalHeaderItems.at(j)->view = nullptr;
            delete verticalHeaderItems.at(j);
            verticalHeaderItems[j] = 0;
        }
    }
    for (int k = 0; k < horizontalHeaderItems.size(); ++k) {
        if (horizontalHeaderItems.at(k)) {
            horizontalHeaderItems.at(k)->view = nullptr;
            delete horizontalHeaderItems.at(k);
            horizontalHeaderItems[k] = 0;
        }
    }
    clearContents();
}